

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageVLine(gdImagePtr im,int x,int y1,int y2,int col)

{
  int iVar1;
  int t;
  int thickhalf;
  int col_local;
  int y2_local;
  int y1_local;
  int x_local;
  gdImagePtr im_local;
  
  if (im->thick < 2) {
    col_local = y1;
    thickhalf = y2;
    if (y2 < y1) {
      col_local = y2;
      thickhalf = y1;
    }
    for (; col_local <= thickhalf; col_local = col_local + 1) {
      gdImageSetPixel(im,x,col_local,col);
    }
  }
  else {
    iVar1 = im->thick >> 1;
    gdImageFilledRectangle(im,x - iVar1,y1,((x + im->thick) - iVar1) + -1,y2,col);
  }
  return;
}

Assistant:

static void gdImageVLine(gdImagePtr im, int x, int y1, int y2, int col)
{
	if (im->thick > 1) {
		int thickhalf = im->thick >> 1;
		gdImageFilledRectangle(im, x - thickhalf, y1, x + im->thick - thickhalf - 1, y2, col);
	} else {
		if (y2 < y1) {
			int t = y1;
			y1 = y2;
			y2 = t;
		}

		for (; y1 <= y2; y1++) {
			gdImageSetPixel(im, x, y1, col);
		}
	}
	return;
}